

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)> * __thiscall
testing::internal::ReturnAction::operator_cast_to_Action
          (Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
           *__return_storage_ptr__,ReturnAction *this)

{
  Impl<ot::commissioner::Error,_ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
  *this_00;
  ReturnAction<ot::commissioner::Error> *this_local;
  
  this_00 = (Impl<ot::commissioner::Error,_ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
             *)operator_new(0x58);
  ReturnAction<ot::commissioner::Error>::
  Impl<ot::commissioner::Error,_ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
  ::Impl(this_00,(shared_ptr<ot::commissioner::Error> *)this);
  Action<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>::Action
            (__return_storage_ptr__,
             (ActionInterface<ot::commissioner::Error_(const_ot::commissioner::ActiveOperationalDataset_&)>
              *)this_00);
  return __return_storage_ptr__;
}

Assistant:

operator Action<F>() const {  // NOLINT
    // Assert statement belongs here because this is the best place to verify
    // conditions on F. It produces the clearest error messages
    // in most compilers.
    // Impl really belongs in this scope as a local class but can't
    // because MSVC produces duplicate symbols in different translation units
    // in this case. Until MS fixes that bug we put Impl into the class scope
    // and put the typedef both here (for use in assert statement) and
    // in the Impl class. But both definitions must be the same.
    typedef typename Function<F>::Result Result;
    GTEST_COMPILE_ASSERT_(
        !std::is_reference<Result>::value,
        use_ReturnRef_instead_of_Return_to_return_a_reference);
    static_assert(!std::is_void<Result>::value,
                  "Can't use Return() on an action expected to return `void`.");
    return Action<F>(new Impl<R, F>(value_));
  }